

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLExtensions.cpp
# Opt level: O2

void sf::priv::ensureExtensionsInit(void)

{
  int iVar1;
  byte *pbVar2;
  ostream *poVar3;
  int majorVersion;
  int local_c;
  
  if (ensureExtensionsInit()::initialized == '\0') {
    ensureExtensionsInit()::initialized = '\x01';
    sfogl_LoadFunctions();
    local_c = 0;
    glGetIntegerv(0x821b);
    glGetIntegerv(0x821c,&local_c);
    iVar1 = glGetError();
    if (iVar1 == 0x500) {
      pbVar2 = (byte *)glGetString(0x1f02);
      if (pbVar2 == (byte *)0x0) {
        iVar1 = 1;
        local_c = iVar1;
      }
      else {
        iVar1 = *pbVar2 - 0x30;
        local_c = pbVar2[2] - 0x30;
      }
    }
    else {
      iVar1 = 0;
    }
    if ((iVar1 < 1) || ((iVar1 == 1 && (local_c < 1)))) {
      poVar3 = err();
      poVar3 = std::operator<<(poVar3,"sfml-graphics requires support for OpenGL 1.1 or greater");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = err();
      poVar3 = std::operator<<(poVar3,"Ensure that hardware acceleration is enabled if available");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  return;
}

Assistant:

void ensureExtensionsInit()
{
#if !defined(SFML_OPENGL_ES)
    static bool initialized = false;
    if (!initialized)
    {
        initialized = true;

        sfogl_LoadFunctions();

        // Retrieve the context version number
        int majorVersion = 0;
        int minorVersion = 0;

        // Try the new way first
        glGetIntegerv(GL_MAJOR_VERSION, &majorVersion);
        glGetIntegerv(GL_MINOR_VERSION, &minorVersion);

        if (glGetError() == GL_INVALID_ENUM)
        {
            // Try the old way
            const GLubyte* version = glGetString(GL_VERSION);
            if (version)
            {
                // The beginning of the returned string is "major.minor" (this is standard)
                majorVersion = version[0] - '0';
                minorVersion = version[2] - '0';
            }
            else
            {
                // Can't get the version number, assume 1.1
                majorVersion = 1;
                minorVersion = 1;
            }
        }

        if ((majorVersion < 1) || ((majorVersion == 1) && (minorVersion < 1)))
        {
            err() << "sfml-graphics requires support for OpenGL 1.1 or greater" << std::endl;
            err() << "Ensure that hardware acceleration is enabled if available" << std::endl;
        }
    }
#endif
}